

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_lambdas.cpp
# Opt level: O0

void (anonymous_namespace)::
     build<poplar::map<poplar::compact_bonsai_trie<90u,4u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>,poplar::compact_bonsai_nlm<int,16ul>>>
               (string *key_name,uint32_t capa_bits,uint64_t lambda,bool detail)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  allocator<char> *__a;
  ostream *poVar4;
  void *this;
  byte in_CL;
  ulong in_RDX;
  string *in_RDI;
  char *pcVar5;
  char_range cVar6;
  timer t;
  string key;
  map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
  map;
  double elapsed_sec;
  uint64_t num_keys;
  ifstream ifs;
  uint64_t process_size;
  string *in_stack_fffffffffffffa28;
  map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
  *in_stack_fffffffffffffa30;
  timer *in_stack_fffffffffffffa40;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  string *this_00;
  int n;
  ostream *in_stack_fffffffffffffa98;
  map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
  *in_stack_fffffffffffffaa0;
  allocator<char> local_551;
  string local_550 [32];
  char_range local_530;
  string local_518 [312];
  uint64_t in_stack_fffffffffffffc20;
  uint32_t in_stack_fffffffffffffc2c;
  map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
  *in_stack_fffffffffffffc30;
  map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
  *in_stack_fffffffffffffd88;
  char_range in_stack_fffffffffffffd90;
  long local_230 [65];
  size_t local_28;
  byte local_19;
  ulong local_18;
  string *local_8;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_28 = poplar::get_process_size();
  std::ifstream::ifstream(local_230,local_8,8);
  bVar1 = std::ios::operator!((ios *)((long)local_230 + *(long *)(local_230[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    poplar::
    map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
    ::map(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,in_stack_fffffffffffffc20);
    this_00 = local_518;
    std::__cxx11::string::string(this_00);
    std::__cxx11::string::reserve((ulong)this_00);
    poplar::timer::timer((timer *)in_stack_fffffffffffffa30);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_230,local_518);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      n = (int)((ulong)this_00 >> 0x20);
      if (!bVar2) break;
      cVar6 = poplar::make_char_range((string *)in_stack_fffffffffffffa30);
      in_stack_fffffffffffffa70 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cVar6.end;
      local_530 = cVar6;
      poplar::
      map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
      ::update(in_stack_fffffffffffffd88,in_stack_fffffffffffffd90);
    }
    pcVar5 = (char *)poplar::timer::get<std::ratio<1l,1l>>(in_stack_fffffffffffffa40);
    __s = pcVar5;
    __a = (allocator<char> *)poplar::get_process_size();
    local_28 = (long)__a - local_28;
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,local_18);
    poVar4 = std::operator<<(poVar4,'\t');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
    poVar4 = std::operator<<(poVar4,'\t');
    this = (void *)std::ostream::operator<<(poVar4,(double)pcVar5);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    if ((local_19 & 1) != 0) {
      in_stack_fffffffffffffa30 =
           (map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
            *)&local_551;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffa70,__s,__a);
      poplar::show_member((ostream *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
                          (char *)0x12a5b0);
      std::__cxx11::string::~string(local_550);
      std::allocator<char>::~allocator(&local_551);
      poplar::
      map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
      ::show_stats(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,n);
    }
    std::__cxx11::string::~string(local_518);
    poplar::
    map<poplar::compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
    ::~map(in_stack_fffffffffffffa30);
    std::ifstream::~ifstream(local_230);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"error: failed to open ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void build(const std::string& key_name, uint32_t capa_bits, uint64_t lambda, bool detail) {
    uint64_t process_size = get_process_size();

    std::ifstream ifs{key_name};
    if (!ifs) {
        std::cerr << "error: failed to open " << key_name << std::endl;
        std::exit(1);
    }

    uint64_t num_keys = 0;
    double elapsed_sec = 0.0;

    Map map{capa_bits, lambda};

    std::string key;
    key.reserve(1024);

    timer t;
    while (std::getline(ifs, key)) {
        map.update(make_char_range(key));
        ++num_keys;
    }

    elapsed_sec = t.get<>();
    process_size = get_process_size() - process_size;

#ifdef POPLAR_EXTRA_STATS
    std::cout << lambda << '\t' << process_size << '\t' << elapsed_sec << '\t' << map.rate_steps() << '\t'
              << map.num_resize() << std::endl;
#else
    std::cout << lambda << '\t' << process_size << '\t' << elapsed_sec << std::endl;
#endif

    if (detail) {
        show_member(std::cout, "", "map");
        map.show_stats(std::cout, 1);
    }
}